

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O3

void disclose(int how,boolean taken)

{
  bool bVar1;
  char cVar2;
  char def;
  boolean show_empty;
  char *pcVar3;
  boolean ask;
  char qbuf [128];
  char local_b8 [136];
  
  ask = '\x01';
  if (flags.end_disclose == 'n') {
    def = 'n';
LAB_00196a40:
    bVar1 = false;
  }
  else {
    if (flags.end_disclose == '-') {
      def = 'n';
    }
    else {
      def = 'y';
      if (flags.end_disclose != '+') goto LAB_00196a40;
    }
    bVar1 = true;
    ask = '\0';
  }
  if (invent != (obj *)0x0) {
    if (taken == '\0') {
      builtin_strncpy(local_b8 + 0x20,"ntified?",9);
      builtin_strncpy(local_b8 + 0x10," possessions ide",0x10);
      builtin_strncpy(local_b8,"Do you want your",0x10);
    }
    else {
      pcVar3 = "died";
      if (how == 0xe) {
        pcVar3 = "quit";
      }
      sprintf(local_b8,"Do you want to see what you had when you %s?",pcVar3);
    }
    if (program_state.stopprint != 0) {
      return;
    }
    cVar2 = def;
    if (!bVar1) {
      cVar2 = yn_function(local_b8,"ynq",def);
    }
    if (cVar2 == 'q') {
      program_state.stopprint = program_state.stopprint + 1;
    }
    else if (cVar2 == 'y') {
      display_inventory((char *)0x0,'\x01');
      container_contents(invent,'\x01',show_empty);
    }
  }
  if (program_state.stopprint == 0) {
    cVar2 = def;
    if (!bVar1) {
      cVar2 = yn_function("Do you want to see your attributes?","ynq",def);
    }
    if (cVar2 == 'q') {
      program_state.stopprint = program_state.stopprint + 1;
    }
    else if (cVar2 == 'y') {
      enlightenment((how < 0xc) + 1);
    }
  }
  if (((program_state.stopprint == 0) && (list_vanquished(def,ask), program_state.stopprint == 0))
     && (list_genocided(def,ask), program_state.stopprint == 0)) {
    if (!bVar1) {
      def = yn_function("Do you want to see your conduct?","ynq",def);
    }
    if (def == 'q') {
      program_state.stopprint = program_state.stopprint + 1;
    }
    else if (def == 'y') {
      show_conduct((how < 0xc) + 1);
    }
  }
  return;
}

Assistant:

static void disclose(int how, boolean taken)
{
	char	c = 0, defquery;
	char	qbuf[QBUFSZ];
	boolean ask = should_query_disclose_options(&defquery);

	if (invent) {
	    if (taken)
		sprintf(qbuf,"Do you want to see what you had when you %s?",
			(how == QUIT) ? "quit" : "died");
	    else
		strcpy(qbuf,"Do you want your possessions identified?");

	    if (!done_stopprint) {
		c = ask ? yn_function(qbuf, ynqchars, defquery) : defquery;
		if (c == 'y') {
		    display_inventory(NULL, TRUE);
		    container_contents(invent, TRUE, TRUE);
		}
		if (c == 'q')  done_stopprint++;
	    }
	}

	if (!done_stopprint) {
	    c = ask ? yn_function("Do you want to see your attributes?",
				  ynqchars, defquery) : defquery;
	    if (c == 'y')
		enlightenment(how >= PANICKED ? 1 : 2); /* final */
	    if (c == 'q') done_stopprint++;
	}

	if (!done_stopprint)
	    list_vanquished(defquery, ask);

	if (!done_stopprint)
	    list_genocided(defquery, ask);

	if (!done_stopprint) {
	    c = ask ? yn_function("Do you want to see your conduct?",
				  ynqchars, defquery) : defquery;
	    if (c == 'y')
		show_conduct(how >= PANICKED ? 1 : 2);
	    if (c == 'q') done_stopprint++;
	}
}